

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPExternalTransmitter::InjectRTPorRTCP
          (RTPExternalTransmitter *this,void *data,size_t len,RTPAddress *a)

{
  bool rtp_00;
  int iVar1;
  RTPMemoryManager *pRVar2;
  undefined4 extraout_var;
  uint8_t *puVar3;
  RTPRawPacket *this_00;
  RTPRawPacket *local_58;
  RTPRawPacket *pack;
  RTPTime curtime;
  uint8_t *pData;
  bool rtp;
  uint8_t *datacopy;
  RTPAddress *addr;
  RTPAddress *a_local;
  size_t len_local;
  void *data_local;
  RTPExternalTransmitter *this_local;
  RTPAddress *address;
  
  if (((this->init & 1U) != 0) && ((this->created & 1U) != 0)) {
    pRVar2 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    iVar1 = (**a->_vptr_RTPAddress)(a,pRVar2);
    address = (RTPAddress *)CONCAT44(extraout_var,iVar1);
    if (address != (RTPAddress *)0x0) {
      rtp_00 = true;
      if (((1 < len) && (curtime.m_t = (double)data, 199 < *(byte *)((long)data + 1))) &&
         (*(byte *)((long)data + 1) < 0xcd)) {
        rtp_00 = false;
      }
      pRVar2 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
      iVar1 = 2;
      if (rtp_00) {
        iVar1 = 1;
      }
      puVar3 = (uint8_t *)operator_new__(len,pRVar2,iVar1);
      if (puVar3 == (uint8_t *)0x0) {
        pRVar2 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        RTPDelete<jrtplib::RTPAddress>(address,pRVar2);
      }
      else {
        memcpy(puVar3,data,len);
        pack = (RTPRawPacket *)RTPTime::CurrentTime();
        pRVar2 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        this_00 = (RTPRawPacket *)operator_new(0x38,pRVar2,0x1b);
        pRVar2 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
        RTPRawPacket::RTPRawPacket(this_00,puVar3,len,address,(RTPTime *)&pack,rtp_00,pRVar2);
        local_58 = this_00;
        if (this_00 == (RTPRawPacket *)0x0) {
          pRVar2 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          RTPDelete<jrtplib::RTPAddress>(address,pRVar2);
          puVar3 = this->localhostname;
          pRVar2 = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
          RTPDeleteByteArray(puVar3,pRVar2);
        }
        else {
          std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::
          push_back(&this->rawpacketlist,&local_58);
          RTPAbortDescriptors::SendAbortSignal(&this->m_abortDesc);
        }
      }
    }
  }
  return;
}

Assistant:

void RTPExternalTransmitter::InjectRTPorRTCP(const void *data, size_t len, const RTPAddress &a)
{
	if (!init)
		return;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return;
	}

	RTPAddress *addr = a.CreateCopy(GetMemoryManager());
	if (addr == 0)
		return;

	uint8_t *datacopy;
	bool rtp = true;

	if (len >= 2)
	{
		const uint8_t *pData = (const uint8_t *)data;
		if (pData[1] >= 200 && pData[1] <= 204)
			rtp = false;
	}

	datacopy = RTPNew(GetMemoryManager(),(rtp)?RTPMEM_TYPE_BUFFER_RECEIVEDRTPPACKET:RTPMEM_TYPE_BUFFER_RECEIVEDRTCPPACKET) uint8_t[len];
	if (datacopy == 0)
	{
		RTPDelete(addr,GetMemoryManager());
		return;
	}
	memcpy(datacopy, data, len);

	RTPTime curtime = RTPTime::CurrentTime();
	RTPRawPacket *pack;

	pack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(datacopy,len,addr,curtime,rtp,GetMemoryManager());
	if (pack == 0)
	{
		RTPDelete(addr,GetMemoryManager());
		RTPDeleteByteArray(localhostname,GetMemoryManager());
		return;
	}
	rawpacketlist.push_back(pack);
	m_abortDesc.SendAbortSignal();

	MAINMUTEX_UNLOCK

}